

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::setCOMTarget
          (InverseKinematics *this,Span<const_double,__1L> desiredPosition,double weight)

{
  Position local_20 [24];
  
  if (desiredPosition.storage_.super_extent_type<_1L>.size_.size_ == 3) {
    iDynTree::Position::Position(local_20,3,desiredPosition.storage_.data_);
    missingIpoptErrorReport();
  }
  else {
    iDynTree::reportError("InverseKinematics","setCOMTarget","Wrong size in input desiredPosition");
  }
  return desiredPosition.storage_.super_extent_type<_1L>.size_.size_ == 3;
}

Assistant:

bool InverseKinematics::setCOMTarget(iDynTree::Span<const double> desiredPosition, double weight)
    {
        constexpr int expected_pos_size = 3;
        bool ok = (desiredPosition.size() == expected_pos_size);
        if( !ok )
        {
            reportError("InverseKinematics","setCOMTarget","Wrong size in input desiredPosition");
            return false;
        }

        this->setCOMTarget(Position(desiredPosition), weight);

        return true;
    }